

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  _Base_ptr p_Var3;
  int iVar4;
  long lVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict *pmVar7;
  _Rb_tree_header *p_Var8;
  TPZGeoElSide neigh;
  long local_a0;
  TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *local_98;
  TPZGeoElSide local_90;
  TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *local_78;
  void **local_70;
  TPZGeoElSideIndex *local_68;
  TPZGeoElSideIndex *local_60;
  long local_58;
  long local_50;
  undefined **local_48;
  TPZGeoEl *local_40;
  int local_38;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap);
  pvVar2 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.fNodeIndexes +
            *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[3];
  local_98 = cp;
  local_78 = this;
  local_70 = vtt + 1;
  pzgeom::TPZNodeRep<8,_pztopology::TPZQuadrilateral>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>,&PTR_PTR_018cc130,
             &(cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>,gl2lcNdMap);
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticQuad_018cc0d8;
  lVar5 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar5) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar5) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar5) = 0xffffffffffffffff;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xd8);
  local_68 = this->fNeighbours;
  local_60 = local_98->fNeighbours;
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar5 = 0;
  do {
    local_50 = lVar5 * 3;
    TPZGeoElSide::TPZGeoElSide(&local_90,local_60 + lVar5,(local_98->super_TPZGeoEl).fMesh);
    local_58 = lVar5;
    while( true ) {
      iVar4 = local_90.fSide;
      local_a0 = (local_90.fGeoEl)->fIndex;
      p_Var3 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(long)*(size_t *)(p_Var3 + 1) < local_a0]) {
        if (local_a0 <= (long)*(size_t *)(p_Var3 + 1)) {
          p_Var6 = p_Var3;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var6,
         local_a0 < (long)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 != p_Var1) break;
      if (local_90.fGeoEl == (TPZGeoEl *)0x0) {
        local_48 = &PTR__TPZGeoElSide_01920090;
        local_40 = (TPZGeoEl *)0x0;
        local_38 = -1;
      }
      else {
        (**(code **)(*(long *)local_90.fGeoEl + 0x188))(&local_48,local_90.fGeoEl,local_90.fSide);
      }
      local_90.fSide = local_38;
      local_90.fGeoEl = local_40;
    }
    pmVar7 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcElMap,&local_a0);
    (&local_68->fGeoElIndex)[local_50] = *pmVar7;
    (&local_68->fSide)[local_50 * 2] = iVar4;
    lVar5 = local_58 + 1;
  } while (lVar5 != 9);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}